

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

TrodesConfig * __thiscall TrodesConfig::operator=(TrodesConfig *this,TrodesConfig *obj)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *in_RDX;
  vector<NDevice,_std::allocator<NDevice>_> local_68;
  vector<NDevice,_std::allocator<NDevice>_> local_48;
  
  iVar1 = copy(obj,(EVP_PKEY_CTX *)obj,in_RDX);
  std::vector<NDevice,_std::allocator<NDevice>_>::vector
            (&local_68,
             (vector<NDevice,_std::allocator<NDevice>_> *)(CONCAT44(extraout_var,iVar1) + 8));
  local_48.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_48.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_finish = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<NDevice,_std::allocator<NDevice>_>::~vector(&local_48);
  std::vector<NDevice,_std::allocator<NDevice>_>::~vector(&local_68);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)&local_68,
             (vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)(CONCAT44(extraout_var,iVar1) + 0x20))
  ;
  local_48.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                super__Vector_impl_data._M_finish;
  (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)&local_48);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)&local_68);
  return this;
}

Assistant:

TrodesConfig& TrodesConfig::operator = (const TrodesConfig &obj) {
    TrodesConfig *objCpy = obj.copy();
    devices = objCpy->getDevices();
    nTrodes = objCpy->getNTrodes();
    return(*this);
}